

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  mz_bool mVar1;
  tdefl_status tVar2;
  FILE *__stream;
  size_t sVar3;
  size_t sVar4;
  mz_ulong mVar5;
  ulong __n;
  long in_RCX;
  char *in_RSI;
  mz_zip_archive *in_RDI;
  ushort in_R8W;
  uint in_R9D;
  tdefl_status status;
  size_t in_buf_size;
  tdefl_compressor *pComp;
  mz_zip_writer_add_state state;
  mz_bool result;
  mz_uint n;
  void *pRead_buf;
  mz_uint64 uncomp_remaining;
  FILE *pSrc_file;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint16 in_stack_00000110;
  mz_uint16 ext_attributes;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint num_alignment_padding_bytes;
  mz_uint level;
  mz_uint uncomp_crc32;
  mz_uint64 in_stack_00000150;
  mz_uint32 in_stack_00000158;
  mz_uint32 in_stack_00000e9c;
  mz_uint64 in_stack_00000ea0;
  mz_zip_archive *in_stack_00000ea8;
  undefined4 in_stack_fffffffffffffe78;
  tdefl_flush in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  undefined4 uVar6;
  tdefl_put_buf_func_ptr in_stack_fffffffffffffe88;
  uint uVar7;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  mz_uint32 in_stack_fffffffffffffea0;
  mz_uint16 method_00;
  undefined4 in_stack_fffffffffffffea8;
  mz_uint16 bit_flags;
  undefined4 in_stack_fffffffffffffeb0;
  mz_uint16 dos_time_00;
  undefined8 in_stack_fffffffffffffeb8;
  mz_uint16 dos_date_00;
  undefined4 in_stack_fffffffffffffec0;
  mz_uint16 *local_130;
  mz_uint16 *local_120;
  void *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  mz_zip_archive *pmVar8;
  mz_uint16 extra_size;
  mz_uint16 *in_stack_ffffffffffffff08;
  mz_uint16 *in_stack_ffffffffffffff10;
  mz_uint16 filename_size;
  int in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  mz_zip_archive *in_stack_ffffffffffffff20;
  mz_uint16 *local_d8;
  undefined1 local_c8 [40];
  size_t local_a0;
  mz_uint16 *local_98;
  mz_uint16 *local_90;
  mz_uint16 *local_88;
  mz_uint64 local_80;
  undefined2 local_74;
  undefined2 local_72;
  ushort local_70;
  undefined2 local_6e;
  mz_uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  ushort local_5a;
  char *local_48;
  mz_zip_archive *local_40;
  mz_bool local_34;
  
  local_64 = 0;
  local_6e = 0;
  local_70 = 0;
  local_72 = 0;
  local_74 = 0;
  local_80 = in_RDI->m_archive_size;
  local_88 = (mz_uint16 *)in_RDI->m_archive_size;
  local_90 = (mz_uint16 *)0x0;
  local_98 = (mz_uint16 *)0x0;
  local_60 = in_R9D;
  if ((int)in_R9D < 0) {
    local_60 = 6;
  }
  local_68 = local_60 & 0xf;
  if (((((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0)) ||
       (in_RDI->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (in_RSI == (char *)0x0)) ||
     (((in_R8W != 0 && (in_RCX == 0)) || (10 < local_68)))) {
    local_34 = 0;
  }
  else if ((local_60 & 0x400) == 0) {
    local_5a = in_R8W;
    local_48 = in_RSI;
    local_40 = in_RDI;
    mVar1 = mz_zip_writer_validate_archive_name(in_RSI);
    if (mVar1 == 0) {
      local_34 = 0;
    }
    else {
      local_a0 = strlen(local_48);
      if (local_a0 < 0x10000) {
        local_6c = mz_zip_writer_compute_padding_needed_for_file_alignment(local_40);
        if ((local_40->m_total_files == 0xffff) ||
           (0xffffffff <
            local_40->m_archive_size + (ulong)local_6c + 0x4c + (ulong)local_5a + local_a0)) {
          local_34 = 0;
        }
        else {
          mVar1 = mz_zip_get_file_modified_time
                            ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          if (mVar1 == 0) {
            local_34 = 0;
          }
          else {
            __stream = (FILE *)mz_fopen(in_stack_fffffffffffffe80,
                                        (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                         in_stack_fffffffffffffe78));
            if (__stream == (FILE *)0x0) {
              local_34 = 0;
            }
            else {
              fseeko(__stream,0,2);
              local_90 = (mz_uint16 *)ftello(__stream);
              fseeko(__stream,0,0);
              if (local_90 < (mz_uint16 *)0x100000000) {
                if (local_90 < (mz_uint16 *)0x4) {
                  local_68 = 0;
                }
                mVar1 = mz_zip_writer_write_zeros
                                  (in_stack_00000ea8,in_stack_00000ea0,in_stack_00000e9c);
                if (mVar1 == 0) {
                  local_34 = 0;
                }
                else {
                  local_80 = local_6c + local_80;
                  local_88 = (mz_uint16 *)((ulong)local_6c + 0x1e + (long)local_88);
                  memset(local_c8,0,0x1e);
                  sVar3 = (*local_40->m_pWrite)
                                    (local_40->m_pIO_opaque,(mz_uint64)local_88,local_48,local_a0);
                  filename_size = (mz_uint16)((ulong)in_stack_ffffffffffffff10 >> 0x30);
                  extra_size = (mz_uint16)((ulong)in_stack_ffffffffffffff00 >> 0x30);
                  dos_date_00 = (mz_uint16)in_stack_fffffffffffffec0;
                  dos_time_00 = (mz_uint16)in_stack_fffffffffffffeb8;
                  bit_flags = (mz_uint16)in_stack_fffffffffffffeb0;
                  method_00 = (mz_uint16)in_stack_fffffffffffffea8;
                  if (sVar3 == local_a0) {
                    local_88 = (mz_uint16 *)(local_a0 + (long)local_88);
                    if (local_90 != (mz_uint16 *)0x0) {
                      local_d8 = local_90;
                      in_stack_ffffffffffffff20 =
                           (mz_zip_archive *)
                           (*local_40->m_pAlloc)(local_40->m_pAlloc_opaque,1,0x10000);
                      if (in_stack_ffffffffffffff20 == (mz_zip_archive *)0x0) {
                        fclose(__stream);
                        return 0;
                      }
                      if (local_68 == 0) {
                        while( true ) {
                          extra_size = (mz_uint16)((ulong)in_stack_ffffffffffffff00 >> 0x30);
                          dos_date_00 = (mz_uint16)in_stack_fffffffffffffec0;
                          dos_time_00 = (mz_uint16)in_stack_fffffffffffffeb8;
                          bit_flags = (mz_uint16)in_stack_fffffffffffffeb0;
                          method_00 = (mz_uint16)in_stack_fffffffffffffea8;
                          if (local_d8 == (mz_uint16 *)0x0) break;
                          if (local_d8 < (mz_uint16 *)0x10001) {
                            local_120 = local_d8;
                          }
                          else {
                            local_120 = (mz_uint16 *)0x10000;
                          }
                          in_stack_ffffffffffffff1c = (uint)local_120;
                          sVar4 = fread(in_stack_ffffffffffffff20,1,(ulong)local_120 & 0xffffffff,
                                        __stream);
                          if ((sVar4 != in_stack_ffffffffffffff1c) ||
                             (sVar3 = (*local_40->m_pWrite)
                                                (local_40->m_pIO_opaque,(mz_uint64)local_88,
                                                 in_stack_ffffffffffffff20,
                                                 (size_t)in_stack_ffffffffffffff1c),
                             sVar3 != in_stack_ffffffffffffff1c)) {
                            (*local_40->m_pFree)
                                      (local_40->m_pAlloc_opaque,in_stack_ffffffffffffff20);
                            fclose(__stream);
                            return 0;
                          }
                          mVar5 = mz_crc32((ulong)local_64,(mz_uint8 *)in_stack_ffffffffffffff20,
                                           (ulong)in_stack_ffffffffffffff1c);
                          local_64 = (uint)mVar5;
                          local_d8 = (mz_uint16 *)
                                     ((long)local_d8 - (ulong)in_stack_ffffffffffffff1c);
                          local_88 = (mz_uint16 *)
                                     ((ulong)in_stack_ffffffffffffff1c + (long)local_88);
                        }
                        local_98 = local_90;
                      }
                      else {
                        in_stack_ffffffffffffff18 = 0;
                        in_stack_fffffffffffffef8 =
                             (*local_40->m_pAlloc)(local_40->m_pAlloc_opaque,1,0x4df78);
                        if (in_stack_fffffffffffffef8 == (void *)0x0) {
                          (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_ffffffffffffff20);
                          fclose(__stream);
                          return 0;
                        }
                        in_stack_ffffffffffffff10 = (mz_uint16 *)0x0;
                        pmVar8 = local_40;
                        in_stack_ffffffffffffff08 = local_88;
                        tdefl_create_comp_flags_from_zip_params(local_68,-0xf,0);
                        tVar2 = tdefl_init((tdefl_compressor *)
                                           CONCAT44(in_stack_fffffffffffffe94,
                                                    in_stack_fffffffffffffe90),
                                           in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                           in_stack_fffffffffffffe7c);
                        if (tVar2 != TDEFL_STATUS_OKAY) {
                          (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_fffffffffffffef8);
                          (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_ffffffffffffff20);
                          fclose(__stream);
                          return 0;
                        }
                        do {
                          if (local_d8 < (mz_uint16 *)0x10000) {
                            local_130 = local_d8;
                          }
                          else {
                            local_130 = (mz_uint16 *)0x10000;
                          }
                          __n = (ulong)local_130 & 0xffffffff;
                          sVar4 = fread(in_stack_ffffffffffffff20,1,__n,__stream);
                          extra_size = (mz_uint16)((ulong)pmVar8 >> 0x30);
                          dos_date_00 = (mz_uint16)in_stack_fffffffffffffec0;
                          dos_time_00 = (mz_uint16)in_stack_fffffffffffffeb8;
                          bit_flags = (mz_uint16)in_stack_fffffffffffffeb0;
                          method_00 = (mz_uint16)in_stack_fffffffffffffea8;
                          if (sVar4 != __n) break;
                          mVar5 = mz_crc32((ulong)local_64,(mz_uint8 *)in_stack_ffffffffffffff20,__n
                                          );
                          local_64 = (uint)mVar5;
                          local_d8 = (mz_uint16 *)((long)local_d8 - __n);
                          tVar2 = tdefl_compress_buffer
                                            ((tdefl_compressor *)
                                             CONCAT44(in_stack_fffffffffffffe94,
                                                      in_stack_fffffffffffffe90),
                                             in_stack_fffffffffffffe88,
                                             (size_t)in_stack_fffffffffffffe80,
                                             in_stack_fffffffffffffe7c);
                          extra_size = (mz_uint16)((ulong)pmVar8 >> 0x30);
                          dos_date_00 = (mz_uint16)in_stack_fffffffffffffec0;
                          dos_time_00 = (mz_uint16)in_stack_fffffffffffffeb8;
                          bit_flags = (mz_uint16)in_stack_fffffffffffffeb0;
                          method_00 = (mz_uint16)in_stack_fffffffffffffea8;
                          if (tVar2 == TDEFL_STATUS_DONE) {
                            in_stack_ffffffffffffff18 = 1;
                            break;
                          }
                        } while (tVar2 == TDEFL_STATUS_OKAY);
                        (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_fffffffffffffef8);
                        if (in_stack_ffffffffffffff18 == 0) {
                          (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_ffffffffffffff20);
                          fclose(__stream);
                          return 0;
                        }
                        local_6e = 8;
                        local_98 = in_stack_ffffffffffffff10;
                        local_88 = in_stack_ffffffffffffff08;
                      }
                      filename_size = (mz_uint16)((ulong)in_stack_ffffffffffffff10 >> 0x30);
                      (*local_40->m_pFree)(local_40->m_pAlloc_opaque,in_stack_ffffffffffffff20);
                    }
                    uVar7 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
                    uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
                    fclose(__stream);
                    if ((local_98 < (mz_uint16 *)0x100000000) &&
                       (local_88 < (mz_uint16 *)0x100000000)) {
                      mVar1 = mz_zip_writer_create_local_dir_header
                                        ((mz_zip_archive *)
                                         CONCAT44(in_stack_fffffffffffffe94,(uint)local_70),
                                         (mz_uint8 *)((ulong)uVar7 << 0x20),
                                         (mz_uint16)((uint)uVar6 >> 0x10),(mz_uint16)uVar6,
                                         CONCAT44(in_stack_fffffffffffffe7c,local_64),0x162991,
                                         in_stack_fffffffffffffea0,method_00,bit_flags,dos_time_00,
                                         dos_date_00);
                      if (mVar1 == 0) {
                        local_34 = 0;
                      }
                      else {
                        sVar3 = (*local_40->m_pWrite)(local_40->m_pIO_opaque,local_80,local_c8,0x1e)
                        ;
                        if (sVar3 == 0x1e) {
                          mVar1 = mz_zip_writer_add_to_central_dir
                                            (in_stack_ffffffffffffff20,
                                             (char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                              in_stack_ffffffffffffff18),
                                             filename_size,in_stack_ffffffffffffff08,extra_size,
                                             in_stack_fffffffffffffef8,in_stack_00000110,_dos_time,
                                             _level,level_and_flags,(mz_uint16)pComment,
                                             (mz_uint16)pSrc_filename,(mz_uint16)pArchive_name,
                                             (mz_uint16)pZip,in_stack_00000150,in_stack_00000158);
                          if (mVar1 == 0) {
                            local_34 = 0;
                          }
                          else {
                            local_40->m_total_files = local_40->m_total_files + 1;
                            local_40->m_archive_size = (mz_uint64)local_88;
                            local_34 = 1;
                          }
                        }
                        else {
                          local_34 = 0;
                        }
                      }
                    }
                    else {
                      local_34 = 0;
                    }
                  }
                  else {
                    fclose(__stream);
                    local_34 = 0;
                  }
                }
              }
              else {
                fclose(__stream);
                local_34 = 0;
              }
            }
          }
        }
      }
      else {
        local_34 = 0;
      }
    }
  }
  else {
    local_34 = 0;
  }
  return local_34;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive* pZip, const char* pArchive_name, const char* pSrc_filename, const void* pComment, mz_uint16 comment_size, mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE* pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes + sizeof(local_dir_header)))
    return MZ_FALSE;
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
  }
  cur_archive_file_ofs += num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void* pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor* pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? TDEFL_NO_FLUSH : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment, comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}